

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ScalarReplacementPass::CanReplaceVariable
          (ScalarReplacementPass *this,Instruction *varInst)

{
  bool bVar1;
  uint32_t uVar2;
  DefUseManager *this_00;
  Instruction *pIVar3;
  
  if (varInst->opcode_ != OpVariable) {
    __assert_fail("varInst->opcode() == spv::Op::OpVariable",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                  ,0x25f,
                  "bool spvtools::opt::ScalarReplacementPass::CanReplaceVariable(const Instruction *) const"
                 );
  }
  uVar2 = Instruction::GetSingleWordInOperand(varInst,0);
  if (uVar2 == 7) {
    this_00 = Pass::get_def_use_mgr((Pass *)this);
    uVar2 = Instruction::type_id(varInst);
    pIVar3 = analysis::DefUseManager::GetDef(this_00,uVar2);
    bVar1 = CheckTypeAnnotations(this,pIVar3);
    if (bVar1) {
      pIVar3 = GetStorageType(this,varInst);
      bVar1 = CheckType(this,pIVar3);
      if (bVar1) {
        bVar1 = CheckAnnotations(this,varInst);
        if (bVar1) {
          bVar1 = CheckUses(this,varInst);
          return bVar1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ScalarReplacementPass::CanReplaceVariable(
    const Instruction* varInst) const {
  assert(varInst->opcode() == spv::Op::OpVariable);

  // Can only replace function scope variables.
  if (spv::StorageClass(varInst->GetSingleWordInOperand(0u)) !=
      spv::StorageClass::Function) {
    return false;
  }

  if (!CheckTypeAnnotations(get_def_use_mgr()->GetDef(varInst->type_id()))) {
    return false;
  }

  const Instruction* typeInst = GetStorageType(varInst);
  if (!CheckType(typeInst)) {
    return false;
  }

  if (!CheckAnnotations(varInst)) {
    return false;
  }

  if (!CheckUses(varInst)) {
    return false;
  }

  return true;
}